

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall QMessageBox::setDefaultButton(QMessageBox *this,QPushButton *button)

{
  undefined1 *puVar1;
  long *plVar2;
  long lVar3;
  undefined1 *puVar4;
  QList<QAbstractButton_*> *pQVar5;
  long in_FS_OFFSET;
  QList<QAbstractButton_*> local_38;
  long local_20;
  
  pQVar5 = &local_38;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  QDialogButtonBox::buttons(&local_38,*(QDialogButtonBox **)(lVar3 + 0x2f8));
  if (local_38.d.size != 0) {
    puVar4 = (undefined1 *)0xfffffffffffffff8;
    do {
      puVar1 = puVar4 + local_38.d.size * -8;
      if (puVar1 == (undefined1 *)0xfffffffffffffff8) goto LAB_0050c5fa;
      pQVar5 = (QList<QAbstractButton_*> *)(puVar4 + 8);
      plVar2 = (long *)((long)(local_38.d.ptr + 1) + (long)puVar4);
      puVar4 = (undefined1 *)pQVar5;
    } while ((QPushButton *)*plVar2 != button);
    pQVar5 = (QList<QAbstractButton_*> *)((long)pQVar5 >> 3);
LAB_0050c5fa:
    if (puVar1 != (undefined1 *)0xfffffffffffffff8) goto LAB_0050c607;
  }
  pQVar5 = (QList<QAbstractButton_*> *)0xffffffffffffffff;
LAB_0050c607:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (pQVar5 != (QList<QAbstractButton_*> *)0xffffffffffffffff) {
    *(QPushButton **)(lVar3 + 800) = button;
    QPushButton::setDefault(button,true);
    QWidget::setFocus((QWidget *)button,OtherFocusReason);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setDefaultButton(QPushButton *button)
{
    Q_D(QMessageBox);
    if (!d->buttonBox->buttons().contains(button))
        return;
    d->defaultButton = button;
    button->setDefault(true);
    button->setFocus();
}